

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O3

void __thiscall llvm::FoldingSetNodeID::AddString(FoldingSetNodeID *this,StringRef String)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint *in_start;
  uint Size;
  uint V;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  uVar3 = String.Length;
  in_start = (uint *)String.Data;
  local_3c = (uint)String.Length;
  SmallVectorTemplateBase<unsigned_int,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_3c);
  uVar4 = local_3c;
  if (local_3c != 0) {
    if (((undefined1  [16])String & (undefined1  [16])0x3) == (undefined1  [16])0x0) {
      SmallVectorImpl<unsigned_int>::append<unsigned_int_const*,void>
                ((SmallVectorImpl<unsigned_int> *)this,in_start,
                 (uint *)((ulong)(local_3c & 0xfffffffc) + (long)in_start));
      uVar4 = (uVar4 & 0xfffffffc) + 4;
    }
    else {
      uVar4 = 4;
      if (3 < local_3c) {
        uVar4 = 4;
        do {
          if ((((uVar3 <= uVar4 - 1) || (uVar3 <= uVar4 - 2)) || (uVar3 <= uVar4 - 3)) ||
             (uVar3 <= uVar4 - 4)) goto LAB_001a200d;
          local_34 = (uint)*(byte *)((long)in_start + (ulong)(uVar4 - 4)) |
                     (uint)*(byte *)((long)in_start + (ulong)(uVar4 - 3)) << 8 |
                     (uint)*(byte *)((long)in_start + (ulong)(uVar4 - 2)) << 0x10 |
                     (uint)*(byte *)((long)in_start + (ulong)(uVar4 - 1)) << 0x18;
          SmallVectorTemplateBase<unsigned_int,_true>::push_back
                    ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_34);
          uVar4 = uVar4 + 4;
        } while (uVar4 <= local_3c);
      }
    }
    iVar5 = uVar4 - local_3c;
    uVar2 = 0;
    uVar4 = 0;
    if (iVar5 != 3) {
      if (iVar5 != 2) {
        if (iVar5 != 1) {
          return;
        }
        if (uVar3 <= local_3c - 3) goto LAB_001a200d;
        bVar1 = *(byte *)((long)in_start + (ulong)(local_3c - 3));
        local_38 = (uint)bVar1;
        uVar4 = (uint)bVar1 << 8;
      }
      if (uVar3 <= local_3c - 2) goto LAB_001a200d;
      uVar2 = (uVar4 | *(byte *)((long)in_start + (ulong)(local_3c - 2))) << 8;
    }
    if (uVar3 <= local_3c - 1) {
LAB_001a200d:
      __assert_fail("Index < Length && \"Invalid index!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0xef,"char llvm::StringRef::operator[](size_t) const");
    }
    local_38 = uVar2 | *(byte *)((long)in_start + (ulong)(local_3c - 1));
    SmallVectorTemplateBase<unsigned_int,_true>::push_back
              ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_38);
  }
  return;
}

Assistant:

void FoldingSetNodeID::AddString(StringRef String) {
  unsigned Size =  String.size();
  Bits.push_back(Size);
  if (!Size) return;

  unsigned Units = Size / 4;
  unsigned Pos = 0;
  const unsigned *Base = (const unsigned*) String.data();

  // If the string is aligned do a bulk transfer.
  if (!((intptr_t)Base & 3)) {
    Bits.append(Base, Base + Units);
    Pos = (Units + 1) * 4;
  } else {
    // Otherwise do it the hard way.
    // To be compatible with above bulk transfer, we need to take endianness
    // into account.
    static_assert(sys::IsBigEndianHost || sys::IsLittleEndianHost,
                  "Unexpected host endianness");
    if (sys::IsBigEndianHost) {
      for (Pos += 4; Pos <= Size; Pos += 4) {
        unsigned V = ((unsigned char)String[Pos - 4] << 24) |
                     ((unsigned char)String[Pos - 3] << 16) |
                     ((unsigned char)String[Pos - 2] << 8) |
                      (unsigned char)String[Pos - 1];
        Bits.push_back(V);
      }
    } else {  // Little-endian host
      for (Pos += 4; Pos <= Size; Pos += 4) {
        unsigned V = ((unsigned char)String[Pos - 1] << 24) |
                     ((unsigned char)String[Pos - 2] << 16) |
                     ((unsigned char)String[Pos - 3] << 8) |
                      (unsigned char)String[Pos - 4];
        Bits.push_back(V);
      }
    }
  }

  // With the leftover bits.
  unsigned V = 0;
  // Pos will have overshot size by 4 - #bytes left over.
  // No need to take endianness into account here - this is always executed.
  switch (Pos - Size) {
  case 1: V = (V << 8) | (unsigned char)String[Size - 3]; LLVM_FALLTHROUGH;
  case 2: V = (V << 8) | (unsigned char)String[Size - 2]; LLVM_FALLTHROUGH;
  case 3: V = (V << 8) | (unsigned char)String[Size - 1]; break;
  default: return; // Nothing left.
  }

  Bits.push_back(V);
}